

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::reset_old_trail(Solver *this)

{
  int iVar1;
  int iVar2;
  Lit *pLVar3;
  uint *puVar4;
  long in_RDI;
  int i;
  vec<unsigned_int> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar2 = local_c;
    iVar1 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x390));
    if (iVar1 <= iVar2) break;
    in_stack_ffffffffffffffd8 = (vec<unsigned_int> *)(in_RDI + 0x3a0);
    pLVar3 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x390),local_c);
    iVar2 = var((Lit)pLVar3->x);
    puVar4 = vec<unsigned_int>::operator[](in_stack_ffffffffffffffd8,iVar2);
    *puVar4 = 0xffffffff;
    local_c = local_c + 1;
  }
  vec<Minisat::Lit>::clear
            ((vec<Minisat::Lit> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
             SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0));
  *(undefined4 *)(in_RDI + 0x388) = 0;
  return;
}

Assistant:

void Solver::reset_old_trail()
{
    TRACE(std::cout << "c reset old trail" << std::endl);
    for (int i = 0; i < old_trail.size(); i++) {
        oldreasons[var(old_trail[i])] = CRef_Undef;
    }
    old_trail.clear();
    old_trail_qhead = 0;
}